

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  bool **ppbVar1;
  char cVar2;
  bool *pbVar3;
  bool bVar4;
  xpath_value_type xVar5;
  size_t sVar6;
  xpath_node *pxVar7;
  char_t *pcVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  xpath_ast_node *local_280;
  xpath_ast_node *local_278;
  xpath_string local_218;
  undefined1 local_200 [8];
  xpath_allocator_capture cr_6;
  undefined1 local_1c8 [8];
  xpath_allocator_capture cr_5;
  double r_2;
  double r_1;
  undefined1 local_180 [8];
  xpath_allocator_capture cri;
  xpath_node *it;
  xpath_node_set_raw ns;
  double r;
  xpath_allocator_capture cr_4;
  undefined1 local_f8 [8];
  xpath_allocator_capture cr_3;
  undefined1 local_c0 [8];
  xpath_allocator_capture cr_2;
  undefined1 local_88 [8];
  xpath_allocator_capture cr_1;
  undefined1 local_48 [8];
  xpath_allocator_capture cr;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  cr._state._error = (bool *)stack;
  switch(this->_type) {
  case '\t':
    dVar10 = eval_number(this->_left,c,stack);
    dVar9 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar10 + dVar9);
    break;
  case '\n':
    dVar10 = eval_number(this->_left,c,stack);
    dVar9 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar10 - dVar9);
    break;
  case '\v':
    dVar10 = eval_number(this->_left,c,stack);
    dVar9 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar10 * dVar9);
    break;
  case '\f':
    dVar10 = eval_number(this->_left,c,stack);
    dVar9 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)(dVar10 / dVar9);
    break;
  case '\r':
    dVar10 = eval_number(this->_left,c,stack);
    dVar9 = eval_number(this->_right,c,(xpath_stack *)cr._state._error);
    this_local = (xpath_ast_node *)fmod(dVar10,dVar9);
    break;
  case '\x0e':
    dVar10 = eval_number(this->_left,c,stack);
    this_local = (xpath_ast_node *)((ulong)dVar10 ^ 0x8000000000000000);
    break;
  default:
    goto LAB_0054b38c;
  case '\x13':
    this_local = (xpath_ast_node *)(this->_data).variable;
    break;
  case '\x14':
    cVar2 = this->_rettype;
    xVar5 = xpath_variable::type((this->_data).variable);
    if ((int)cVar2 != xVar5) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x29f3,
                    "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x02') {
      dVar10 = xpath_variable::get_number((this->_data).variable);
      return dVar10;
    }
LAB_0054b38c:
    cVar2 = this->_rettype;
    if (cVar2 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_200,*(xpath_allocator **)cr._state._error);
      eval_string(&local_218,this,c,(xpath_stack *)cr._state._error);
      pcVar8 = xpath_string::c_str(&local_218);
      this_local = (xpath_ast_node *)convert_string_to_number(pcVar8);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_200);
    }
    else if (cVar2 == '\x03') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_1c8,*(xpath_allocator **)cr._state._error);
      eval_string((xpath_string *)&cr_6._state._error,this,c,(xpath_stack *)cr._state._error);
      pcVar8 = xpath_string::c_str((xpath_string *)&cr_6._state._error);
      this_local = (xpath_ast_node *)convert_string_to_number(pcVar8);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1c8);
    }
    else {
      if (cVar2 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type number\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2a15,
                      "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar4 = eval_boolean(this,c,(xpath_stack *)cr._state._error);
      this_local = (xpath_ast_node *)(double)bVar4;
    }
    break;
  case '\x15':
    sVar6 = c->size;
    auVar11._8_4_ = (int)(sVar6 >> 0x20);
    auVar11._0_8_ = sVar6;
    auVar11._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
    break;
  case '\x16':
    sVar6 = c->position;
    auVar12._8_4_ = (int)(sVar6 >> 0x20);
    auVar12._0_8_ = sVar6;
    auVar12._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
    break;
  case '\x17':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_48,stack->result);
    ppbVar1 = &cr_1._state._error;
    eval_node_set((xpath_node_set_raw *)ppbVar1,this->_left,c,(xpath_stack *)cr._state._error,
                  nodeset_eval_all);
    sVar6 = xpath_node_set_raw::size((xpath_node_set_raw *)ppbVar1);
    auVar13._8_4_ = (int)(sVar6 >> 0x20);
    auVar13._0_8_ = sVar6;
    auVar13._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_48);
    break;
  case '(':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_88,stack->result);
    ppbVar1 = &cr_2._state._error;
    string_value((xpath_string *)ppbVar1,&c->n,*(xpath_allocator **)cr._state._error);
    sVar6 = xpath_string::length((xpath_string *)ppbVar1);
    auVar14._8_4_ = (int)(sVar6 >> 0x20);
    auVar14._0_8_ = sVar6;
    auVar14._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_88);
    break;
  case ')':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_c0,stack->result);
    ppbVar1 = &cr_3._state._error;
    eval_string((xpath_string *)ppbVar1,this->_left,c,(xpath_stack *)cr._state._error);
    sVar6 = xpath_string::length((xpath_string *)ppbVar1);
    auVar15._8_4_ = (int)(sVar6 >> 0x20);
    auVar15._0_8_ = sVar6;
    auVar15._12_4_ = 0x45300000;
    this_local = (xpath_ast_node *)
                 ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_c0);
    break;
  case '2':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)local_f8,stack->result);
    string_value((xpath_string *)&cr_4._state._error,&c->n,*(xpath_allocator **)cr._state._error);
    pcVar8 = xpath_string::c_str((xpath_string *)&cr_4._state._error);
    this_local = (xpath_ast_node *)convert_string_to_number(pcVar8);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_f8);
    break;
  case '3':
    this_local = (xpath_ast_node *)eval_number(this->_left,c,stack);
    break;
  case '4':
    xpath_allocator_capture::xpath_allocator_capture((xpath_allocator_capture *)&r,stack->result);
    ns._eos = (xpath_node *)0x0;
    eval_node_set((xpath_node_set_raw *)&it,this->_left,c,(xpath_stack *)cr._state._error,
                  nodeset_eval_all);
    for (cri._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&it);
        pbVar3 = cri._state._error, pxVar7 = xpath_node_set_raw::end((xpath_node_set_raw *)&it),
        (xpath_node *)pbVar3 != pxVar7; cri._state._error = cri._state._error + 0x10) {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_180,*(xpath_allocator **)cr._state._error);
      string_value((xpath_string *)&r_1,(xpath_node *)cri._state._error,
                   *(xpath_allocator **)cr._state._error);
      pcVar8 = xpath_string::c_str((xpath_string *)&r_1);
      dVar10 = convert_string_to_number(pcVar8);
      ns._eos = (xpath_node *)(dVar10 + (double)ns._eos);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_180);
    }
    this_local = (xpath_ast_node *)ns._eos;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&r);
    break;
  case '5':
    local_278 = (xpath_ast_node *)eval_number(this->_left,c,stack);
    if (!NAN((double)local_278)) {
      local_278 = (xpath_ast_node *)floor((double)local_278);
    }
    this_local = local_278;
    break;
  case '6':
    local_280 = (xpath_ast_node *)eval_number(this->_left,c,stack);
    if (!NAN((double)local_280)) {
      cr_5._state._error = (bool *)local_280;
      local_280 = (xpath_ast_node *)ceil((double)local_280);
    }
    this_local = local_280;
    break;
  case '7':
    dVar10 = eval_number(this->_left,c,stack);
    this_local = (xpath_ast_node *)round_nearest_nzero(dVar10);
  }
  return (double)this_local;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return eval_boolean(c, stack) ? 1 : 0;

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(eval_string(c, stack).c_str());
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(eval_string(c, stack).c_str());
			}

			default:
				assert(false && "Wrong expression for return type number"); // unreachable
				return 0;
			}
		}